

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::performPass(QualifiedIdentifierResolver *this)

{
  ASTVisitor local_38;
  void *pvStack_30;
  undefined8 local_28;
  long lStack_20;
  
  RewritingASTVisitor::visitObject
            ((RewritingASTVisitor *)this,
             (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.module);
  if (this->numVariablesResolved != 0) {
    local_38._vptr_ASTVisitor = (_func_int **)&PTR__RecursiveVariableInitialiserCheck_002d76b0;
    pvStack_30 = (void *)0x0;
    local_28 = 0;
    lStack_20 = 0;
    ASTVisitor::visitObject
              (&local_38,
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.module);
    local_38._vptr_ASTVisitor = (_func_int **)&PTR__RecursiveVariableInitialiserCheck_002d76b0;
    if (pvStack_30 != (void *)0x0) {
      operator_delete(pvStack_30,lStack_20 - (long)pvStack_30);
    }
  }
  return;
}

Assistant:

void performPass()
        {
            super::performPass();

            if (numVariablesResolved > 0)
            {
                struct RecursiveVariableInitialiserCheck  : public ASTVisitor
                {
                    void visit (AST::VariableDeclaration& v) override
                    {
                        if (contains (stack, pool_ptr<AST::VariableDeclaration> (v)))
                            v.context.throwError (Errors::initialiserRefersToTarget (v.name));

                        if (v.initialValue != nullptr)
                            stack.push_back (v);

                        ASTVisitor::visit (v);

                        if (v.initialValue != nullptr)
                            stack.pop_back();
                    }

                    void visit (AST::VariableRef& vr) override
                    {
                        visit (vr.variable);
                    }

                    std::vector<pool_ref<AST::VariableDeclaration>> stack;
                };

                RecursiveVariableInitialiserCheck().visitObject (module);
            }
        }